

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool *bufPool)

{
  size_t __size;
  ZSTD_freeFunction p_Var1;
  ZSTD_allocFunction p_Var2;
  uint uVar3;
  void *__ptr;
  ulong uVar4;
  buffer_t bVar5;
  
  __size = bufPool->bufferSize;
  pthread_mutex_lock((pthread_mutex_t *)bufPool);
  if (bufPool->nbBuffers != 0) {
    uVar3 = bufPool->nbBuffers - 1;
    bufPool->nbBuffers = uVar3;
    __ptr = bufPool->bTable[uVar3].start;
    uVar4 = bufPool->bTable[uVar3].capacity;
    bufPool->bTable[uVar3].start = (void *)0x0;
    bufPool->bTable[uVar3].capacity = 0;
    if (uVar4 >> 3 <= __size && __size <= uVar4) {
      pthread_mutex_unlock((pthread_mutex_t *)bufPool);
    }
    else if (__ptr != (void *)0x0) {
      p_Var1 = (bufPool->cMem).customFree;
      if (p_Var1 == (ZSTD_freeFunction)0x0) {
        free(__ptr);
      }
      else {
        (*p_Var1)((bufPool->cMem).opaque,__ptr);
      }
    }
    if (uVar4 >> 3 <= __size && __size <= uVar4) goto LAB_001c0fc0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)bufPool);
  p_Var2 = (bufPool->cMem).customAlloc;
  if (p_Var2 == (ZSTD_allocFunction)0x0) {
    __ptr = malloc(__size);
  }
  else {
    __ptr = (*p_Var2)((bufPool->cMem).opaque,__size);
  }
  uVar4 = __size;
  if (__ptr == (void *)0x0) {
    uVar4 = 0;
  }
LAB_001c0fc0:
  bVar5.capacity = uVar4;
  bVar5.start = __ptr;
  return bVar5;
}

Assistant:

static buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool* bufPool)
{
    size_t const bSize = bufPool->bufferSize;
    DEBUGLOG(5, "ZSTDMT_getBuffer: bSize = %u", (U32)bufPool->bufferSize);
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    if (bufPool->nbBuffers) {   /* try to use an existing buffer */
        buffer_t const buf = bufPool->bTable[--(bufPool->nbBuffers)];
        size_t const availBufferSize = buf.capacity;
        bufPool->bTable[bufPool->nbBuffers] = g_nullBuffer;
        if ((availBufferSize >= bSize) & ((availBufferSize>>3) <= bSize)) {
            /* large enough, but not too much */
            DEBUGLOG(5, "ZSTDMT_getBuffer: provide buffer %u of size %u",
                        bufPool->nbBuffers, (U32)buf.capacity);
            ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
            return buf;
        }
        /* size conditions not respected : scratch this buffer, create new one */
        DEBUGLOG(5, "ZSTDMT_getBuffer: existing buffer does not meet size conditions => freeing");
        ZSTD_customFree(buf.start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
    /* create new buffer */
    DEBUGLOG(5, "ZSTDMT_getBuffer: create a new buffer");
    {   buffer_t buffer;
        void* const start = ZSTD_customMalloc(bSize, bufPool->cMem);
        buffer.start = start;   /* note : start can be NULL if malloc fails ! */
        buffer.capacity = (start==NULL) ? 0 : bSize;
        if (start==NULL) {
            DEBUGLOG(5, "ZSTDMT_getBuffer: buffer allocation failure !!");
        } else {
            DEBUGLOG(5, "ZSTDMT_getBuffer: created buffer of size %u", (U32)bSize);
        }
        return buffer;
    }
}